

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromIstream(MessageLite *this,istream *input)

{
  bool bVar1;
  IstreamInputStream zero_copy_input;
  
  io::IstreamInputStream::IstreamInputStream(&zero_copy_input,input,-1);
  bVar1 = ParsePartialFromZeroCopyStream(this,&zero_copy_input.super_ZeroCopyInputStream);
  if (bVar1) {
    bVar1 = (bool)(((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) >> 1);
  }
  else {
    bVar1 = false;
  }
  io::IstreamInputStream::~IstreamInputStream(&zero_copy_input);
  return bVar1;
}

Assistant:

bool MessageLite::ParsePartialFromIstream(std::istream* input) {
  io::IstreamInputStream zero_copy_input(input);
  return ParsePartialFromZeroCopyStream(&zero_copy_input) && input->eof();
}